

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

int __thiscall
CTPNSym::gen_code_asi
          (CTPNSym *this,int discard,int phase,tc_asitype_t typ,char *op,CTcPrsNode *rhs,
          int ignore_errors,int xplicit,void **ctx)

{
  CTcPrsSymtab *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcSymbol *pCVar3;
  
  this_00 = G_cs->symtab_;
  iVar1 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xc])();
  iVar2 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xd])(this);
  pCVar3 = CTcPrsSymtab::find_or_def_prop_implied
                     (this_00,(char *)CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2),0
                      ,(byte)G_cs->field_0xa8 & 1);
  iVar1 = (*(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
            [0x19])(pCVar3,(ulong)(uint)discard,(ulong)(uint)phase,(ulong)typ,op,rhs);
  return iVar1;
}

Assistant:

int CTPNSym::gen_code_asi(int discard, int phase,
                          tc_asitype_t typ, const char *op,
                          CTcPrsNode *rhs,
                          int ignore_errors, int xplicit, void **ctx)
{
    /* 
     *   Look up the symbol; if it's undefined and there's a "self" object
     *   available, define it as a property by default, since a property
     *   is the only kind of symbol that we could possibly assign to
     *   without having defined anywhere in the program.  Once we have the
     *   symbol, tell it to generate the code for assigning to it.  
     */
    return G_cs->get_symtab()
        ->find_or_def_prop_implied(get_sym_text(), get_sym_text_len(),
                                   FALSE, G_cs->is_self_available())
        ->gen_code_asi(discard, phase, typ, op, rhs,
                       ignore_errors, xplicit, ctx);
}